

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall
ON_PolyCurve::Evaluate
          (ON_PolyCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  ON_Curve *pOVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint hint_00;
  double *pdVar4;
  double *knot;
  int iVar5;
  ulong uVar6;
  uint hint_01;
  bool bVar7;
  undefined4 extraout_XMM0_Db;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int curve_hint;
  ON_Interval local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  
  iVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (v_stride < (int)uVar3) {
    return false;
  }
  if (iVar5 < 1) {
    return false;
  }
  if ((int)uVar3 < 1) {
    return false;
  }
  if (hint == (int *)0x0) {
    hint_01 = 0;
  }
  else {
    hint_01 = *hint & 0x3fff;
  }
  iVar5 = iVar5 + 1;
  if ((this->m_t).m_count < 1) {
    pdVar4 = (double *)0x0;
  }
  else {
    pdVar4 = (this->m_t).m_a;
  }
  hint_00 = ON_NurbsSpanIndex(2,iVar5,pdVar4,t,side,hint_01);
  if (((side == 2) || (side == -2)) && (side != 0)) {
    pdVar4 = (this->m_t).m_a;
    dVar8 = pdVar4[(int)hint_00];
    if ((dVar8 < t) && (dVar9 = pdVar4[(long)(int)hint_00 + 1], t < dVar9)) {
      in_XMM1_Qa = (dVar9 - dVar8) * 1e-10;
      if (side < 0) {
        in_XMM1_Qa = in_XMM1_Qa + dVar8;
        if (t <= in_XMM1_Qa) goto LAB_00589d9e;
      }
      else {
        dVar8 = dVar9;
        if (dVar9 - in_XMM1_Qa <= t) {
LAB_00589d9e:
          knot = (double *)0x0;
          if (0 < (this->m_t).m_count) {
            knot = pdVar4;
          }
          hint_00 = ON_NurbsSpanIndex(2,iVar5,knot,dVar8,side,hint_00);
          t = dVar8;
        }
      }
    }
  }
  pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)hint_00];
  if (pOVar1 == (ON_Curve *)0x0) {
    return false;
  }
  (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
  local_68.m_t[1] = in_XMM1_Qa;
  local_68.m_t[0]._4_4_ = extraout_XMM0_Db;
  dVar8 = ON_Interval::Min(&local_68);
  local_48 = ON_Interval::Max(&local_68);
  if ((dVar8 == local_48) && (!NAN(dVar8) && !NAN(local_48))) {
    return false;
  }
  pdVar4 = (this->m_t).m_a;
  local_58 = pdVar4[(int)hint_00];
  dVar9 = pdVar4[(long)(int)hint_00 + 1];
  if ((((dVar8 == local_58) && (!NAN(dVar8) && !NAN(local_58))) && (local_48 == dVar9)) &&
     (!NAN(local_48) && !NAN(dVar9))) goto LAB_00589f70;
  dVar10 = dVar9 - local_58;
  if (ABS(local_58) * 2.220446049250313e-16 + 2.3283064365386963e-10 <= ABS(dVar10)) {
    auVar11._0_8_ = dVar9 - t;
    auVar11._8_8_ = t - local_58;
    auVar2._8_8_ = dVar10;
    auVar2._0_8_ = dVar10;
    auVar12 = divpd(auVar11,auVar2);
    dVar10 = auVar12._0_8_;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      if ((dVar10 != 1.0) || (NAN(dVar10))) {
        if ((auVar12._8_8_ != 0.0) || (NAN(auVar12._8_8_))) {
          if ((auVar12._8_8_ == 1.0) && (!NAN(auVar12._8_8_))) {
            dVar10 = 0.0;
            goto LAB_00589f01;
          }
        }
        else {
          auVar12._0_8_ = 0x3ff0000000000000;
        }
      }
      else {
        auVar12 = ZEXT816(0x3ff0000000000000);
      }
    }
    else {
LAB_00589f01:
      auVar12._8_8_ = 1.0;
      auVar12._0_8_ = dVar10;
    }
    t = auVar12._0_8_ * dVar8 + auVar12._8_8_ * local_48;
  }
  else {
    uVar6 = -(ulong)(ABS(t - local_58) < ABS(t - dVar9));
    t = (double)(~uVar6 & (ulong)local_48 | uVar6 & (ulong)dVar8);
  }
  if (side == -1) {
    side = 0xfffffffe;
  }
  else if (side == 1) {
    side = 2;
  }
LAB_00589f70:
  uStack_50 = 0;
  iVar5 = 0;
  if ((hint != (int *)0x0) && (iVar5 = 0, hint_01 == hint_00)) {
    iVar5 = *hint >> 0xe;
  }
  local_68.m_t[0] = (double)CONCAT44(local_68.m_t[0]._4_4_,iVar5);
  iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                    (t,pOVar1,(ulong)(uint)der_count,(ulong)(uint)v_stride,v,(ulong)(uint)side);
  if ((char)iVar5 == '\0') {
    return false;
  }
  if (0 < der_count) {
    if ((local_58 != dVar9) || (NAN(local_58) || NAN(dVar9))) {
      local_48 = local_48 - dVar8;
      dVar9 = dVar9 - local_58;
      if ((local_48 != dVar9) || (NAN(local_48) || NAN(dVar9))) {
        pdVar4 = v + (uint)v_stride;
        dVar8 = local_48 / dVar9;
        iVar5 = 1;
        do {
          uVar6 = 0;
          do {
            pdVar4[uVar6] = pdVar4[uVar6] * dVar8;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
          dVar8 = dVar8 * (local_48 / dVar9);
          pdVar4 = pdVar4 + (uint)v_stride;
          bVar7 = iVar5 != der_count;
          iVar5 = iVar5 + 1;
        } while (bVar7);
      }
    }
  }
  if (hint != (int *)0x0) {
    *hint = local_68.m_t[0]._0_4_ << 0xe | hint_00;
    return true;
  }
  return true;
}

Assistant:

bool ON_PolyCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  const int count = Count();
  const int dim = Dimension();
  int segment_hint, curve_hint;
  if ( count > 0 && dim > 0 && dim <= v_stride ) 
  {
    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_hint);
    if ( -2 == side || 2 == side )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //   When evaluation passes through ON_CurveProxy or ON_PolyCurve reparamterization
      //   and the original side parameter was -1 or +1, it is changed to -2 or +2
      //   to indicate that if t is numerically closed to an end parameter, then
      //   it should be tuned up to be at the end parameter.
      double a = t;
      if ( ON_TuneupEvaluationParameter( side, m_t[segment_index], m_t[segment_index+1], &a) )
      {
        // recalculate segment index
        t = a;
        segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_index);
      }
    }
    const ON_Curve* c = m_segment[segment_index];
    if ( c ) {
      double s0, s1;
      {
        ON_Interval dom = c->Domain();
        s0 = dom.Min();
        s1 = dom.Max();
      }
      if ( s0 != s1 ) 
      {
        const double t0 = m_t[segment_index];
        const double t1 = m_t[segment_index+1];
        double s;
        if ( s0 == t0 && s1 == t1 )
        {
          // segment domain = c->Domain()
          s = t;
        }
        else 
        {
          // adjust segment domain parameter
          if ( fabs(t1 - t0) < (ON_ZERO_TOLERANCE + ON_EPSILON*fabs(t0)) )
          {
            // segment domain is insanely short
            s = (fabs(t-t0) < fabs(t-t1)) ? s0 : s1;
          }
          else 
          {
            // 30 May 2012 Dale Lear bug # 105974
            //   The arithmetic below was setting b = 0 and a = 0.9999999999999...
            //   so I added the checking for 0 and 1 stuff.
            const double d = t1-t0;
            double a = (t - t0)/d;
            double b = (t1 - t)/d;
            if ( 0.0 == b )
              a = 1.0;
            else if ( 1.0 == b )
              a = 0.0;
            else if ( 0.0 == a )
              b = 1.0;
            else if ( 1.0 == a )
              b = 0.0;
            s = b*s0 + a*s1;
          }
          if ( -1 == side )
            side = -2;
          else if ( 1 == side )
            side = 2;
        }
        curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;
        rc = c->Evaluate(
           s, 
           der_count, 
           v_stride, v, 
           side, 
           &curve_hint );

        if ( rc ) 
        {
          if ( der_count > 0 && s1 - s0 != t1 - t0 && t0 != t1 )
          {
            // Adjust segment derivative evaluation bug by applying chain rule
            // to get polycurve derivative value.
            const double d = (s1-s0)/(t1-t0);
            s = d;
            int di, vi;
            v += v_stride;
            for ( di = 1; di <= der_count; di++ )
            {
              for ( vi = 0; vi < dim; vi++ ) 
              {
                v[vi] = s*v[vi];
              }
              s *= d;
              v += v_stride;
            }
          }

          if ( hint )
            *hint = segment_index | (curve_hint<<14);
        }

      }
    }
  }
  return rc;
}